

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GPUShader5PreciseQualifier::iterate(GPUShader5PreciseQualifier *this)

{
  GLfloat GVar1;
  GLuint GVar2;
  GLuint component_nr_1;
  long lVar3;
  char *description;
  int iVar4;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint component_nr;
  long lVar5;
  float fVar6;
  float fVar7;
  GLfloat vertex_data_weights [4];
  GLfloat vertex_data_positions [4];
  WeightedSum weighted_sum_backward [4];
  WeightedSum weighted_sum_forward [4];
  
  initTest(this);
  TestCaseBase::randomSeed(&this->super_TestCaseBase,1);
  iVar4 = 0;
  do {
    if (iVar4 == 100) {
      this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00d023d5;
    }
    fVar6 = 1.0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      GVar2 = TestCaseBase::randomFormula(&this->super_TestCaseBase,2000);
      vertex_data_positions[lVar5] = (float)(int)(GVar2 - 1000);
      fVar7 = fVar6;
      if (lVar5 != 3) {
        GVar2 = TestCaseBase::randomFormula(&this->super_TestCaseBase,1000);
        fVar6 = fVar6 - (float)GVar2 / 1000.0;
        fVar7 = (float)GVar2 / 1000.0;
      }
      vertex_data_weights[lVar5] = fVar7;
    }
    drawAndGetFeedbackResult(this,vertex_data_positions,vertex_data_weights,weighted_sum_forward);
    lVar5 = 0xc;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      GVar1 = vertex_data_positions[lVar3];
      vertex_data_positions[lVar3] = *(GLfloat *)((long)vertex_data_positions + lVar5);
      *(GLfloat *)((long)vertex_data_positions + lVar5) = GVar1;
      GVar1 = vertex_data_weights[lVar3];
      vertex_data_weights[lVar3] = *(GLfloat *)((long)vertex_data_weights + lVar5);
      *(GLfloat *)((long)vertex_data_weights + lVar5) = GVar1;
      lVar5 = lVar5 + -4;
    }
    drawAndGetFeedbackResult(this,vertex_data_positions,vertex_data_weights,weighted_sum_backward);
  } while ((((weighted_sum_backward[0].intv == weighted_sum_backward[1].intv) &&
            (weighted_sum_backward[0].intv == weighted_sum_backward[2].intv)) &&
           (weighted_sum_backward[0].intv == weighted_sum_forward[0].intv)) &&
          ((weighted_sum_backward[0].intv == weighted_sum_forward[1].intv &&
           (iVar4 = iVar4 + 1, weighted_sum_backward[0].intv == weighted_sum_forward[2].intv))));
  this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00d023d5:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5PreciseQualifier::iterate(void)
{
	initTest();

	/* Set the seed for the random generator */
	randomSeed(1);

	glw::GLboolean test_failed = false;

	for (glw::GLuint test_iter = 0; test_iter < m_n_iterations; ++test_iter)
	{
		/* Create the data for positions and weights attributes */
		glw::GLfloat vertex_data_positions[m_n_components];
		glw::GLfloat vertex_data_weights[m_n_components];
		glw::GLfloat weights_sum = 1.0f;

		for (glw::GLuint component_nr = 0; component_nr < m_n_components; ++component_nr)
		{
			vertex_data_positions[component_nr] = static_cast<glw::GLfloat>(
				static_cast<glw::GLint>(randomFormula(2 * m_position_range)) - m_position_range);

			if (component_nr != (m_n_components - 1))
			{
				glw::GLfloat random_value = static_cast<glw::GLfloat>(randomFormula(m_position_range)) /
											static_cast<glw::GLfloat>(m_position_range);

				vertex_data_weights[component_nr] = random_value;
				weights_sum -= random_value;
			}
			else
			{
				vertex_data_weights[component_nr] = weights_sum;
			}
		}

		/* Compute forward weighted sum */
		WeightedSum weighted_sum_forward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_forward);

		/* Reverse the data for positions and weights attributes */
		glw::GLfloat temp_value = 0.0f;

		for (glw::GLuint component_nr = 0; component_nr < (m_n_components / 2); ++component_nr)
		{
			temp_value = vertex_data_positions[component_nr];

			vertex_data_positions[component_nr] = vertex_data_positions[m_n_components - 1 - component_nr];
			vertex_data_positions[m_n_components - 1 - component_nr] = temp_value;

			temp_value = vertex_data_weights[component_nr];

			vertex_data_weights[component_nr] = vertex_data_weights[m_n_components - 1 - component_nr];
			vertex_data_weights[m_n_components - 1 - component_nr] = temp_value;
		}

		/* Compute backward weighted sum */
		WeightedSum weighted_sum_backward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_backward);

		/* Check if results are bitwise accurate */
		if (weighted_sum_backward[0].intv != weighted_sum_backward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_backward[2].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[0].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[2].intv)
		{
			test_failed = true;
			break;
		}
	}

	if (test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}